

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbkeyboard.cpp
# Opt level: O3

void __thiscall QXcbKeyboard::updateKeymap(QXcbKeyboard *this)

{
  xkb_context *pxVar1;
  QXcbConnection *pQVar2;
  xkb_keymap *pxVar3;
  xkb_state *pxVar4;
  xkb_context *pxVar5;
  QXcbKeyboard *pQVar6;
  xkb_keymap *pxVar7;
  xkb_state *pxVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
  local_30;
  KeysymModifierMap local_28;
  QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
  local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_*>
          )0x0;
  if ((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_hasXkb == false) {
    keysymsToModifiers((QXcbKeyboard *)&local_30);
    local_28.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
            )local_30.d.ptr;
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_*>
          )(QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>
            *)0x0;
    local_20.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_*>
          )(QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>
            *)0x0;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_20);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_30);
  }
  updateModifiers(this,&local_28);
  this->m_config = true;
  if ((this->m_xkbContext)._M_t.super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>.
      _M_t.super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
      super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl == (xkb_context *)0x0) {
    pxVar5 = (xkb_context *)xkb_context_new(1);
    pxVar1 = (this->m_xkbContext)._M_t.
             super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>._M_t.
             super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
             super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl;
    (this->m_xkbContext)._M_t.super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>._M_t
    .super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
    super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl = pxVar5;
    if (pxVar1 != (xkb_context *)0x0) {
      xkb_context_unref();
      pxVar5 = (this->m_xkbContext)._M_t.
               super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>._M_t.
               super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
               super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl;
    }
    pQVar6 = (QXcbKeyboard *)QtPrivateLogging::lcQpaKeyboard();
    if (pxVar5 != (xkb_context *)0x0) {
      uVar9 = 10;
      if ((pQVar6->m_config & 1U) != 0) {
        uVar9 = 0x32;
      }
      xkb_context_set_log_level
                ((this->m_xkbContext)._M_t.
                 super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>._M_t.
                 super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
                 super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl,uVar9);
      goto LAB_001617ec;
    }
    if ((pQVar6->m_isAutoRepeat & 1U) != 0) {
      updateKeymap(pQVar6);
    }
  }
  else {
LAB_001617ec:
    pQVar2 = (this->super_QXcbObject).m_connection;
    if ((pQVar2->super_QXcbBasicConnection).m_hasXkb == true) {
      pxVar7 = (xkb_keymap *)
               xkb_x11_keymap_new_from_device
                         ((this->m_xkbContext)._M_t.
                          super___uniq_ptr_impl<xkb_context,_QXkbCommon::XKBContextDeleter>._M_t.
                          super__Tuple_impl<0UL,_xkb_context_*,_QXkbCommon::XKBContextDeleter>.
                          super__Head_base<0UL,_xkb_context_*,_false>._M_head_impl,
                          (pQVar2->super_QXcbBasicConnection).m_xcbConnection,this->core_device_id,0
                         );
      pxVar3 = (this->m_xkbKeymap)._M_t.
               super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
               super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
               super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl;
      (this->m_xkbKeymap)._M_t.super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
      super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
      super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl = pxVar7;
      if (pxVar3 != (xkb_keymap *)0x0) {
        xkb_keymap_unref();
        pxVar7 = (this->m_xkbKeymap)._M_t.
                 super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
                 super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
                 super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl;
      }
      if (pxVar7 != (xkb_keymap *)0x0) {
        pxVar8 = (xkb_state *)
                 xkb_x11_state_new_from_device
                           (pxVar7,(((this->super_QXcbObject).m_connection)->
                                   super_QXcbBasicConnection).m_xcbConnection,this->core_device_id);
LAB_0016186b:
        pxVar4 = (this->m_xkbState)._M_t.
                 super___uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter>._M_t.
                 super__Tuple_impl<0UL,_xkb_state_*,_QXkbCommon::XKBStateDeleter>.
                 super__Head_base<0UL,_xkb_state_*,_false>._M_head_impl;
        (this->m_xkbState)._M_t.super___uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter>._M_t.
        super__Tuple_impl<0UL,_xkb_state_*,_QXkbCommon::XKBStateDeleter>.
        super__Head_base<0UL,_xkb_state_*,_false>._M_head_impl = pxVar8;
        if (pxVar4 != (xkb_state *)0x0) {
          xkb_state_unref();
        }
      }
    }
    else {
      pxVar7 = keymapFromCore(this,&local_28);
      pxVar3 = (this->m_xkbKeymap)._M_t.
               super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
               super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
               super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl;
      (this->m_xkbKeymap)._M_t.super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
      super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
      super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl = pxVar7;
      if (pxVar3 != (xkb_keymap *)0x0) {
        xkb_keymap_unref();
        pxVar7 = (this->m_xkbKeymap)._M_t.
                 super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
                 super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
                 super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl;
      }
      if (pxVar7 != (xkb_keymap *)0x0) {
        pxVar8 = (xkb_state *)xkb_state_new(pxVar7);
        goto LAB_0016186b;
      }
    }
    if ((this->m_xkbKeymap)._M_t.super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>.
        _M_t.super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
        super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl == (xkb_keymap *)0x0) {
      pQVar6 = (QXcbKeyboard *)QtPrivateLogging::lcQpaKeyboard();
      if ((pQVar6->m_isAutoRepeat & 1U) != 0) {
        updateKeymap(pQVar6);
      }
    }
    else {
      if ((this->m_xkbState)._M_t.super___uniq_ptr_impl<xkb_state,_QXkbCommon::XKBStateDeleter>._M_t
          .super__Tuple_impl<0UL,_xkb_state_*,_QXkbCommon::XKBStateDeleter>.
          super__Head_base<0UL,_xkb_state_*,_false>._M_head_impl != (xkb_state *)0x0) {
        updateXKBMods(this);
        QXkbCommon::verifyHasLatinLayout
                  ((this->m_xkbKeymap)._M_t.
                   super___uniq_ptr_impl<xkb_keymap,_QXkbCommon::XKBKeymapDeleter>._M_t.
                   super__Tuple_impl<0UL,_xkb_keymap_*,_QXkbCommon::XKBKeymapDeleter>.
                   super__Head_base<0UL,_xkb_keymap_*,_false>._M_head_impl);
        goto LAB_001618d8;
      }
      pQVar6 = (QXcbKeyboard *)QtPrivateLogging::lcQpaKeyboard();
      if ((pQVar6->m_isAutoRepeat & 1U) != 0) {
        updateKeymap(pQVar6);
      }
    }
  }
  this->m_config = false;
LAB_001618d8:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28.d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbKeyboard::updateKeymap()
{
    KeysymModifierMap keysymMods;
    if (!connection()->hasXKB())
        keysymMods = keysymsToModifiers();
    updateModifiers(keysymMods);

    m_config = true;

    if (!m_xkbContext) {
        m_xkbContext.reset(xkb_context_new(XKB_CONTEXT_NO_DEFAULT_INCLUDES));
        if (!m_xkbContext) {
            qCWarning(lcQpaKeyboard, "failed to create XKB context");
            m_config = false;
            return;
        }
        xkb_log_level logLevel = lcQpaKeyboard().isDebugEnabled() ?
                                 XKB_LOG_LEVEL_DEBUG : XKB_LOG_LEVEL_CRITICAL;
        xkb_context_set_log_level(m_xkbContext.get(), logLevel);
    }

    if (connection()->hasXKB()) {
        m_xkbKeymap.reset(xkb_x11_keymap_new_from_device(m_xkbContext.get(), xcb_connection(),
                                                         core_device_id, XKB_KEYMAP_COMPILE_NO_FLAGS));
        if (m_xkbKeymap)
            m_xkbState.reset(xkb_x11_state_new_from_device(m_xkbKeymap.get(), xcb_connection(), core_device_id));
    } else {
        m_xkbKeymap.reset(keymapFromCore(keysymMods));
        if (m_xkbKeymap)
            m_xkbState.reset(xkb_state_new(m_xkbKeymap.get()));
    }

    if (!m_xkbKeymap) {
        qCWarning(lcQpaKeyboard, "failed to compile a keymap");
        m_config = false;
        return;
    }
    if (!m_xkbState) {
        qCWarning(lcQpaKeyboard, "failed to create XKB state");
        m_config = false;
        return;
    }

    updateXKBMods();

    QXkbCommon::verifyHasLatinLayout(m_xkbKeymap.get());
}